

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O2

int satoko_simplify(solver_t *s)

{
  long *plVar1;
  vec_uint_t *p;
  long lVar2;
  char cVar3;
  uint uVar4;
  uint value;
  int iVar5;
  uint i;
  ulong uVar6;
  uint *puVar7;
  uint idx;
  
  if (s->trail_lim->size != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0xcf,"int satoko_simplify(solver_t *)");
  }
  uVar4 = solver_propagate(s);
  iVar5 = 0;
  if (uVar4 == 0xffffffff) {
    iVar5 = 1;
    if ((s->n_assigns_simplify != s->trail->size) && (s->n_props_simplify < 1)) {
      uVar4 = 0;
      for (idx = 0; p = s->originals, idx < p->size; idx = idx + 1) {
        value = vec_uint_at(p,idx);
        if (value == 0xffffffff) {
          puVar7 = (uint *)0x0;
        }
        else {
          puVar7 = s->all_clauses->data + value;
        }
        uVar6 = 0;
        do {
          if (puVar7[1] <= uVar6) {
            vec_uint_assign(s->originals,uVar4,value);
            uVar4 = uVar4 + 1;
            goto LAB_0046c755;
          }
          cVar3 = lit_value(s,puVar7[uVar6 + 2]);
          uVar6 = uVar6 + 1;
        } while (cVar3 != '\0');
        *(byte *)puVar7 = (byte)*puVar7 | 2;
        plVar1 = &(s->stats).n_original_lits;
        *plVar1 = *plVar1 - (ulong)puVar7[1];
        clause_unwatch(s,value);
LAB_0046c755:
      }
      vec_uint_shrink(p,uVar4);
      solver_rebuild_order(s);
      lVar2 = (s->stats).n_learnt_lits;
      s->n_assigns_simplify = s->trail->size;
      s->n_props_simplify = lVar2 + (s->stats).n_original_lits;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int satoko_simplify(solver_t * s)
{
    unsigned i, j = 0;
    unsigned cref;

    assert(solver_dlevel(s) == 0);
    if (solver_propagate(s) != UNDEF)
        return SATOKO_ERR;
    if (s->n_assigns_simplify == vec_uint_size(s->trail) || s->n_props_simplify > 0)
        return SATOKO_OK;

    vec_uint_foreach(s->originals, cref, i) {
        struct clause *clause = clause_fetch(s, cref);

    if (clause_is_satisfied(s, clause)) {
            clause->f_mark = 1;
            s->stats.n_original_lits -= clause->size;
            clause_unwatch(s, cref);
        } else
            vec_uint_assign(s->originals, j++, cref);
    }
    vec_uint_shrink(s->originals, j);
    solver_rebuild_order(s);
    s->n_assigns_simplify = vec_uint_size(s->trail);
    s->n_props_simplify = s->stats.n_original_lits + s->stats.n_learnt_lits;
    return SATOKO_OK;
}